

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::ConfidentialTransactionContext::SignWithPrivkeySimple
          (ConfidentialTransactionContext *this,OutPoint *outpoint,Pubkey *pubkey,Privkey *privkey,
          SigHashType *sighash_type,ConfidentialValue *value,AddressType address_type,
          bool has_grind_r)

{
  WitnessVersion WVar1;
  ByteData signature;
  SigHashType local_d8;
  SigHashType local_cc;
  ByteData sighash;
  SignParameter sign;
  
  WVar1 = TransactionContextUtil::CheckSignWithPrivkeySimple(outpoint,pubkey,privkey,address_type);
  core::SigHashType::SigHashType(&local_cc,sighash_type);
  (*(this->super_ConfidentialTransaction).super_AbstractTransaction._vptr_AbstractTransaction[0x16])
            (&sighash,this,outpoint,pubkey,&local_cc,value,WVar1);
  core::ByteData256::ByteData256((ByteData256 *)&sign,&sighash);
  core::SignatureUtil::CalculateEcSignature
            (&signature,(ByteData256 *)&sign,privkey,has_grind_r,false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sign);
  core::SigHashType::SigHashType(&local_d8,sighash_type);
  SignParameter::SignParameter(&sign,&signature,true,&local_d8);
  AddPubkeyHashSign(this,outpoint,&sign,pubkey,address_type);
  SignParameter::~SignParameter(&sign);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash);
  return;
}

Assistant:

void ConfidentialTransactionContext::SignWithPrivkeySimple(
    const OutPoint& outpoint, const Pubkey& pubkey, const Privkey& privkey,
    SigHashType sighash_type, const ConfidentialValue& value,
    AddressType address_type, bool has_grind_r) {
  WitnessVersion version = TransactionContextUtil::CheckSignWithPrivkeySimple(
      outpoint, pubkey, privkey, address_type);

  ByteData sighash =
      CreateSignatureHash(outpoint, pubkey, sighash_type, value, version);
  ByteData signature = SignatureUtil::CalculateEcSignature(
      ByteData256(sighash), privkey, has_grind_r);
  SignParameter sign(signature, true, sighash_type);

  AddPubkeyHashSign(outpoint, sign, pubkey, address_type);
}